

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O0

int virtual_print_insn(dill_stream c,void *info_ptr,void *i)

{
  ulong uVar1;
  undefined4 uVar2;
  uint uVar3;
  char *pcVar4;
  private_ctx pdVar5;
  undefined8 uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  char *pcVar10;
  char *pcVar11;
  undefined1 *in_RDX;
  dill_stream_conflict in_RDI;
  int typ_10;
  int typ_9;
  int non_var_arg;
  int typ_8;
  char *call_name_1;
  char *call_name;
  int reg;
  int typ_7;
  branch_table *t_3;
  branch_table *t_2;
  branch_table *t_1;
  int br_op_1;
  int c_op;
  branch_table *t;
  int br_op;
  int typ_6;
  int typ_5;
  int typ_4;
  anon_union_8_2_31a1d66b u;
  int typ_3;
  int typ_2;
  int bswap_1;
  int store_1;
  int typ_1;
  int bswap;
  int store;
  int typ;
  int to_index;
  int from_index;
  int insn_code;
  virtual_insn *insn;
  undefined8 in_stack_fffffffffffffd28;
  undefined4 uVar12;
  undefined8 in_stack_fffffffffffffd38;
  undefined4 uVar13;
  uint local_2ac;
  uint local_29c;
  uint local_284;
  uint local_264;
  uint local_248;
  uint local_244;
  undefined4 local_234;
  uint local_228;
  uint local_21c;
  uint local_210;
  uint local_204;
  uint local_1f4;
  uint local_1e8;
  uint local_1dc;
  uint local_1cc;
  uint local_1bc;
  uint local_1b0;
  uint local_1a4;
  undefined4 local_1a0;
  uint local_194;
  undefined4 local_174;
  undefined4 local_168;
  uint local_15c;
  uint local_140;
  uint local_134;
  uint local_120;
  uint local_114;
  uint local_108;
  uint local_fc;
  undefined4 local_ec;
  uint local_e0;
  uint local_d4;
  
  uVar12 = (undefined4)((ulong)in_stack_fffffffffffffd28 >> 0x20);
  uVar13 = (undefined4)((ulong)in_stack_fffffffffffffd38 >> 0x20);
  iVar8 = (int)(char)in_RDX[1];
  switch(*in_RDX) {
  case 0:
    pcVar10 = arith3_name[iVar8];
    if (*(int *)(in_RDX + 8) < 100) {
      local_d4 = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 8));
      local_d4 = 0x52;
      if (iVar8 == 0xc) {
        local_d4 = 0x42;
      }
    }
    uVar9 = *(uint *)(in_RDX + 8);
    if (*(int *)(in_RDX + 0xc) < 100) {
      local_e0 = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 0xc));
      local_e0 = 0x52;
      if (iVar8 == 0xc) {
        local_e0 = 0x42;
      }
    }
    uVar3 = *(uint *)(in_RDX + 0xc);
    if (*(int *)(in_RDX + 0x10) < 100) {
      local_ec = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 0x10));
      local_ec = 0x52;
      if (iVar8 == 0xc) {
        local_ec = 0x42;
      }
    }
    printf("%s %c%d, %c%d, %c%d",pcVar10,(ulong)local_d4,(ulong)uVar9,(ulong)local_e0,(ulong)uVar3,
           CONCAT44(uVar12,local_ec),*(undefined4 *)(in_RDX + 0x10));
    break;
  case 1:
    pcVar10 = arith3_name[iVar8];
    if (*(int *)(in_RDX + 8) < 100) {
      local_fc = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 8));
      local_fc = 0x52;
      if (iVar8 == 0xc) {
        local_fc = 0x42;
      }
    }
    uVar9 = *(uint *)(in_RDX + 8);
    if (*(int *)(in_RDX + 0xc) < 100) {
      local_108 = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 0xc));
      local_108 = 0x52;
      if (iVar8 == 0xc) {
        local_108 = 0x42;
      }
    }
    printf("%si %c%d, %c%d, %zu",pcVar10,(ulong)local_fc,(ulong)uVar9,(ulong)local_108,
           (ulong)*(uint *)(in_RDX + 0xc),*(undefined8 *)(in_RDX + 0x10));
    break;
  case 2:
    pcVar10 = arith2_name[iVar8];
    if (*(int *)(in_RDX + 8) < 100) {
      local_114 = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 8));
      local_114 = 0x52;
      if (iVar8 == 0xc) {
        local_114 = 0x42;
      }
    }
    uVar9 = *(uint *)(in_RDX + 8);
    if (*(int *)(in_RDX + 0xc) < 100) {
      local_120 = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 0xc));
      local_120 = 0x52;
      if (iVar8 == 0xc) {
        local_120 = 0x42;
      }
    }
    printf("%s %c%d, %c%d",pcVar10,(ulong)local_114,(ulong)uVar9,(ulong)local_120,
           (ulong)*(uint *)(in_RDX + 0xc));
    break;
  case 3:
    pcVar10 = dill_type_names[(int)((int)(char)in_RDX[1] & 0xf)];
    if (*(int *)(in_RDX + 8) < 100) {
      local_1f4 = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 8));
      local_1f4 = 0x52;
      if (iVar8 == 0xc) {
        local_1f4 = 0x42;
      }
    }
    printf("ret%s %c%d",pcVar10,(ulong)local_1f4,(ulong)*(uint *)(in_RDX + 8));
    break;
  case 4:
    pcVar10 = dill_type_names[(int)((int)(char)in_RDX[1] >> 4 & 0xf)];
    pcVar11 = dill_type_names[(int)((int)(char)in_RDX[1] & 0xf)];
    if (*(int *)(in_RDX + 8) < 100) {
      local_134 = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 8));
      local_134 = 0x52;
      if (iVar8 == 0xc) {
        local_134 = 0x42;
      }
    }
    uVar9 = *(uint *)(in_RDX + 8);
    if (*(int *)(in_RDX + 0xc) < 100) {
      local_140 = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 0xc));
      local_140 = 0x52;
      if (iVar8 == 0xc) {
        local_140 = 0x42;
      }
    }
    printf("cv%s2%s %c%d, %c%d",pcVar10,pcVar11,(ulong)local_134,(ulong)uVar9,(ulong)local_140,
           CONCAT44(uVar12,*(undefined4 *)(in_RDX + 0xc)));
    break;
  case 5:
    pcVar10 = "";
    if ((in_RDX[1] & 0x20) == 0x20) {
      pcVar10 = "bs";
    }
    pcVar11 = "st";
    if ((in_RDX[1] & 0x10) != 0x10) {
      pcVar11 = "ld";
    }
    pcVar4 = dill_type_names[(int)((int)(char)in_RDX[1] & 0xf)];
    if (*(int *)(in_RDX + 8) < 100) {
      local_15c = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 8));
      local_15c = 0x52;
      if (iVar8 == 0xc) {
        local_15c = 0x42;
      }
    }
    uVar9 = *(uint *)(in_RDX + 8);
    if (*(int *)(in_RDX + 0xc) < 100) {
      local_168 = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 0xc));
      local_168 = 0x52;
      if (iVar8 == 0xc) {
        local_168 = 0x42;
      }
    }
    uVar2 = *(undefined4 *)(in_RDX + 0xc);
    if (*(int *)(in_RDX + 0x10) < 100) {
      local_174 = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 0x10));
      local_174 = 0x52;
      if (iVar8 == 0xc) {
        local_174 = 0x42;
      }
    }
    printf("%s%s%s %c%d, %c%d, %c%d",pcVar10,pcVar11,pcVar4,(ulong)local_15c,(ulong)uVar9,
           CONCAT44(uVar12,local_168),uVar2,CONCAT44(uVar13,local_174),
           *(undefined4 *)(in_RDX + 0x10));
    break;
  case 6:
    pcVar10 = "";
    if ((in_RDX[1] & 0x20) == 0x20) {
      pcVar10 = "bs";
    }
    pcVar11 = "st";
    if ((in_RDX[1] & 0x10) != 0x10) {
      pcVar11 = "ld";
    }
    pcVar4 = dill_type_names[(int)((int)(char)in_RDX[1] & 0xf)];
    if (*(int *)(in_RDX + 8) < 100) {
      local_194 = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 8));
      local_194 = 0x52;
      if (iVar8 == 0xc) {
        local_194 = 0x42;
      }
    }
    uVar9 = *(uint *)(in_RDX + 8);
    if (*(int *)(in_RDX + 0xc) < 100) {
      local_1a0 = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 0xc));
      local_1a0 = 0x52;
      if (iVar8 == 0xc) {
        local_1a0 = 0x42;
      }
    }
    printf("%s%s%si %c%d, %c%d, %zu",pcVar10,pcVar11,pcVar4,(ulong)local_194,(ulong)uVar9,
           CONCAT44(uVar12,local_1a0),*(undefined4 *)(in_RDX + 0xc),*(undefined8 *)(in_RDX + 0x10));
    break;
  case 7:
    pcVar10 = dill_type_names[(int)((int)(char)in_RDX[1] & 0xf)];
    if (*(int *)(in_RDX + 8) < 100) {
      local_1bc = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 8));
      local_1bc = 0x52;
      if (iVar8 == 0xc) {
        local_1bc = 0x42;
      }
    }
    printf("set%s %c%d, %zx",pcVar10,(ulong)local_1bc,(ulong)*(uint *)(in_RDX + 8),
           *(undefined8 *)(in_RDX + 0x10));
    break;
  case 8:
    uVar1 = *(ulong *)(in_RDX + 0x10);
    pcVar10 = dill_type_names[(int)((int)(char)in_RDX[1] & 0xf)];
    if (*(int *)(in_RDX + 8) < 100) {
      local_1cc = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 8));
      local_1cc = 0x52;
      if (iVar8 == 0xc) {
        local_1cc = 0x42;
      }
    }
    printf("set%s %c%d, %g 0x(%x)0x(%x)",*(undefined8 *)(in_RDX + 0x10),pcVar10,(ulong)local_1cc,
           (ulong)*(uint *)(in_RDX + 8),uVar1 & 0xffffffff,uVar1 >> 0x20);
    break;
  case 9:
    pcVar10 = dill_type_names[(int)((int)(char)in_RDX[1] & 0xf)];
    if (*(int *)(in_RDX + 8) < 100) {
      local_1dc = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 8));
      local_1dc = 0x52;
      if (iVar8 == 0xc) {
        local_1dc = 0x42;
      }
    }
    uVar9 = *(uint *)(in_RDX + 8);
    if (*(int *)(in_RDX + 0xc) < 100) {
      local_1e8 = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 0xc));
      local_1e8 = 0x52;
      if (iVar8 == 0xc) {
        local_1e8 = 0x42;
      }
    }
    printf("mov%s %c%d, %c%d",pcVar10,(ulong)local_1dc,(ulong)uVar9,(ulong)local_1e8,
           (ulong)*(uint *)(in_RDX + 0xc));
    break;
  case 10:
    printf("ret%si %zu",dill_type_names[(int)((int)(char)in_RDX[1] & 0xf)],
           *(undefined8 *)(in_RDX + 0x10));
    break;
  case 0xb:
    pdVar5 = in_RDI->p;
    pcVar10 = branch_op_names[(int)(char)in_RDX[1]];
    if (*(int *)(in_RDX + 8) < 100) {
      local_204 = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 8));
      local_204 = 0x52;
      if (iVar8 == 0xc) {
        local_204 = 0x42;
      }
    }
    uVar9 = *(uint *)(in_RDX + 8);
    if (*(int *)(in_RDX + 0xc) < 100) {
      local_210 = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 0xc));
      local_210 = 0x52;
      if (iVar8 == 0xc) {
        local_210 = 0x42;
      }
    }
    printf("b%s %c%d, %c%d, L%d",pcVar10,(ulong)local_204,(ulong)uVar9,(ulong)local_210,
           (ulong)*(uint *)(in_RDX + 0xc),CONCAT44(uVar12,*(undefined4 *)(in_RDX + 0x10)));
    if ((pdVar5->branch_table).label_name[*(int *)(in_RDX + 0x10)] != (char *)0x0) {
      printf("<%s>",(pdVar5->branch_table).label_name[*(int *)(in_RDX + 0x10)]);
    }
    break;
  case 0xc:
    pdVar5 = in_RDI->p;
    pcVar10 = branch_op_names[(int)(char)in_RDX[1]];
    if (*(int *)(in_RDX + 8) < 100) {
      local_244 = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 8));
      local_244 = 0x52;
      if (iVar8 == 0xc) {
        local_244 = 0x42;
      }
    }
    printf("b%si %c%d, %p, L%d",pcVar10,(ulong)local_244,(ulong)*(uint *)(in_RDX + 8),
           *(undefined8 *)(in_RDX + 0x18),(ulong)*(uint *)(in_RDX + 0xc));
    if ((pdVar5->branch_table).label_name[*(int *)(in_RDX + 0xc)] != (char *)0x0) {
      printf("<%s>",(pdVar5->branch_table).label_name[*(int *)(in_RDX + 0xc)]);
    }
    break;
  case 0xd:
    pdVar5 = in_RDI->p;
    printf("br L%d",(ulong)*(uint *)(in_RDX + 0x10));
    if ((pdVar5->branch_table).label_name[*(int *)(in_RDX + 0x10)] != (char *)0x0) {
      printf("<%s>",(pdVar5->branch_table).label_name[*(int *)(in_RDX + 0x10)]);
    }
    break;
  case 0xe:
    if (*(int *)(in_RDX + 8) == 0) {
      printf("special NOP");
    }
    else if (*(int *)(in_RDX + 8) == 1) {
      printf("special SEGMENTED %s",prefix_names[*(long *)(in_RDX + 0x10)]);
    }
    break;
  case 0xf:
    if (*(int *)(in_RDX + 8) < 100) {
      local_248 = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 8));
      local_248 = 0x52;
      if (iVar8 == 0xc) {
        local_248 = 0x42;
      }
    }
    printf("jmp %c%d",(ulong)local_248,(ulong)*(uint *)(in_RDX + 8));
    break;
  case 0x10:
    printf("jmp 0x%p",*(undefined8 *)(in_RDX + 0x10));
    break;
  case 0x11:
    if ((short)*(undefined4 *)(in_RDX + 8) < 0) {
      if ((short)*(undefined4 *)(in_RDX + 8) == -1) {
        printf("pushinit");
      }
      else {
        printf("pushinit varidiac, %d nonvar args",
               (ulong)(0xfffffffe - (int)(short)*(undefined4 *)(in_RDX + 8)));
      }
    }
    else {
      pcVar10 = dill_type_names[(int)((int)(char)in_RDX[1] & 0xf)];
      if (*(int *)(in_RDX + 8) < 100) {
        local_2ac = 0x50;
      }
      else {
        iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 8));
        local_2ac = 0x52;
        if (iVar8 == 0xc) {
          local_2ac = 0x42;
        }
      }
      printf("push%s %c%d",pcVar10,(ulong)local_2ac,(ulong)*(uint *)(in_RDX + 8));
    }
    break;
  case 0x12:
    if (((int)(char)in_RDX[1] & 0xfU) == 8) {
      printf("push%si 0x%p",dill_type_names[8],*(undefined8 *)(in_RDX + 0x10));
    }
    else {
      printf("push%si 0x%zx",dill_type_names[(int)((int)(char)in_RDX[1] & 0xfU)],
             *(undefined8 *)(in_RDX + 0x10));
    }
    break;
  case 0x13:
    printf("push%si %g",*(undefined8 *)(in_RDX + 0x10),dill_type_names[(int)(char)in_RDX[1]]);
    break;
  case 0x14:
    uVar9 = (int)(char)in_RDX[1] & 0xf;
    if (uVar9 == 0xb) {
      if ((in_RDX[1] & 0x10) == 0) {
        if (*(long *)(in_RDX + 0x20) == 0) {
          printf("call%s 0x%p",dill_type_names[0xb],*(undefined8 *)(in_RDX + 0x10));
        }
        else {
          printf("call%s 0x%p<%s>",dill_type_names[0xb],*(undefined8 *)(in_RDX + 0x10),
                 *(long *)(in_RDX + 0x20));
        }
      }
      else {
        printf("call%s R%p",dill_type_names[0xb],*(undefined8 *)(in_RDX + 0x18));
      }
    }
    else if ((in_RDX[1] & 0x10) == 0) {
      lVar7 = *(long *)(in_RDX + 0x20);
      if (lVar7 == 0) {
        pcVar10 = dill_type_names[(int)uVar9];
        uVar6 = *(undefined8 *)(in_RDX + 0x10);
        if (*(int *)(in_RDX + 8) < 100) {
          local_29c = 0x50;
        }
        else {
          iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 8));
          local_29c = 0x52;
          if (iVar8 == 0xc) {
            local_29c = 0x42;
          }
        }
        printf("call%s 0x%p, %c%d",pcVar10,uVar6,(ulong)local_29c,(ulong)*(uint *)(in_RDX + 8));
      }
      else {
        pcVar10 = dill_type_names[(int)uVar9];
        uVar6 = *(undefined8 *)(in_RDX + 0x10);
        if (*(int *)(in_RDX + 8) < 100) {
          local_284 = 0x50;
        }
        else {
          iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 8));
          local_284 = 0x52;
          if (iVar8 == 0xc) {
            local_284 = 0x42;
          }
        }
        printf("call%s 0x%p<%s>, %c%d",pcVar10,uVar6,lVar7,(ulong)local_284,
               (ulong)*(uint *)(in_RDX + 8));
      }
    }
    else {
      pcVar10 = dill_type_names[(int)uVar9];
      uVar6 = *(undefined8 *)(in_RDX + 0x18);
      if (*(int *)(in_RDX + 8) < 100) {
        local_264 = 0x50;
      }
      else {
        iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 8));
        local_264 = 0x52;
        if (iVar8 == 0xc) {
          local_264 = 0x42;
        }
      }
      printf("call%s R%p, %c%d",pcVar10,uVar6,(ulong)local_264,(ulong)*(uint *)(in_RDX + 8));
    }
    break;
  case 0x15:
    if (*(int *)(in_RDX + 8) < 100) {
      local_1a4 = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 8));
      local_1a4 = 0x52;
      if (iVar8 == 0xc) {
        local_1a4 = 0x42;
      }
    }
    uVar9 = *(uint *)(in_RDX + 8);
    if (*(int *)(in_RDX + 0xc) < 100) {
      local_1b0 = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 0xc));
      local_1b0 = 0x52;
      if (iVar8 == 0xc) {
        local_1b0 = 0x42;
      }
    }
    printf("lea %c%d, %c%d, %zx",(ulong)local_1a4,(ulong)uVar9,(ulong)local_1b0,
           (ulong)*(uint *)(in_RDX + 0xc),*(undefined8 *)(in_RDX + 0x10));
    break;
  case 0x16:
    pcVar10 = compare_op_names[(int)(char)in_RDX[1]];
    if (*(int *)(in_RDX + 8) < 100) {
      local_21c = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 8));
      local_21c = 0x52;
      if (iVar8 == 0xc) {
        local_21c = 0x42;
      }
    }
    uVar9 = *(uint *)(in_RDX + 8);
    if (*(int *)(in_RDX + 0xc) < 100) {
      local_228 = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 0xc));
      local_228 = 0x52;
      if (iVar8 == 0xc) {
        local_228 = 0x42;
      }
    }
    uVar3 = *(uint *)(in_RDX + 0xc);
    if (*(int *)(in_RDX + 0x10) < 100) {
      local_234 = 0x50;
    }
    else {
      iVar8 = dill_type_of(in_RDI,*(int *)(in_RDX + 0x10));
      local_234 = 0x52;
      if (iVar8 == 0xc) {
        local_234 = 0x42;
      }
    }
    printf("%s %c%d, %c%d, %c%d",pcVar10,(ulong)local_21c,(ulong)uVar9,(ulong)local_228,(ulong)uVar3
           ,CONCAT44(uVar12,local_234),*(undefined4 *)(in_RDX + 0x10));
    break;
  case 0x17:
    pdVar5 = in_RDI->p;
    printf("L%d:",(ulong)*(uint *)(in_RDX + 8));
    if ((pdVar5->branch_table).label_name[*(int *)(in_RDX + 8)] != (char *)0x0) {
      printf("<%s>",(pdVar5->branch_table).label_name[*(int *)(in_RDX + 8)]);
    }
    break;
  case 0x18:
    printf("nop");
  }
  return 0x28;
}

Assistant:

extern int
virtual_print_insn(dill_stream c, void* info_ptr, void* i)
{
    virtual_insn* insn = (virtual_insn*)i;
    int insn_code = insn->insn_code;
    switch (insn->class_code) {
    case iclass_arith3:
        printf("%s %c%d, %c%d, %c%d", arith3_name[insn_code],
               OPND(insn->opnds.a3.dest), OPND(insn->opnds.a3.src1),
               OPND(insn->opnds.a3.src2));
        break;
    case iclass_arith3i:
        printf("%si %c%d, %c%d, %zu", arith3_name[insn_code],
               OPND(insn->opnds.a3i.dest), OPND(insn->opnds.a3i.src),
               insn->opnds.a3i.u.imm);
        break;
    case iclass_arith2:
        printf("%s %c%d, %c%d", arith2_name[insn_code],
               OPND(insn->opnds.a2.dest), OPND(insn->opnds.a2.src));
        break;
    case iclass_convert: {
        int from_index = (insn->insn_code >> 4) & 0xf;
        int to_index = insn->insn_code & 0xf;
        printf("cv%s2%s %c%d, %c%d", dill_type_names[from_index],
               dill_type_names[to_index], OPND(insn->opnds.a2.dest),
               OPND(insn->opnds.a2.src));
        break;
    }
    case iclass_loadstore: {
        int typ = insn->insn_code & 0xf;
        int store = (insn->insn_code & 0x10) == 0x10;
        int bswap = (insn->insn_code & 0x20) == 0x20;
        printf("%s%s%s %c%d, %c%d, %c%d", bswap ? "bs" : "",
               store == 0 ? "ld" : "st", dill_type_names[typ],
               OPND(insn->opnds.a3.dest), OPND(insn->opnds.a3.src1),
               OPND(insn->opnds.a3.src2));
        break;
    }
    case iclass_loadstorei: {
        int typ = insn->insn_code & 0xf;
        int store = (insn->insn_code & 0x10) == 0x10;
        int bswap = (insn->insn_code & 0x20) == 0x20;
        printf("%s%s%si %c%d, %c%d, %zu", bswap ? "bs" : "",
               store == 0 ? "ld" : "st", dill_type_names[typ],
               OPND(insn->opnds.a3i.dest), OPND(insn->opnds.a3i.src),
               insn->opnds.a3i.u.imm);
        break;
    }
    case iclass_lea: {
        printf("lea %c%d, %c%d, %zx", OPND(insn->opnds.a3i.dest),
               OPND(insn->opnds.a3i.src), insn->opnds.a3i.u.imm);
        break;
    }
    case iclass_set: {
        int typ = insn->insn_code & 0xf;
        printf("set%s %c%d, %zx", dill_type_names[typ],
               OPND(insn->opnds.a3i.dest), insn->opnds.a3i.u.imm);
        break;
    }
    case iclass_setf: {
        int typ = insn->insn_code & 0xf;
        union {
            double imm;
            int imm_i[2];
        } u;
        u.imm = insn->opnds.sf.imm;
        printf("set%s %c%d, %g 0x(%x)0x(%x)", dill_type_names[typ],
               OPND(insn->opnds.sf.dest), insn->opnds.sf.imm, u.imm_i[0],
               u.imm_i[1]);
        break;
    }
    case iclass_mov: {
        int typ = insn->insn_code & 0xf;
        printf("mov%s %c%d, %c%d", dill_type_names[typ],
               OPND(insn->opnds.a2.dest), OPND(insn->opnds.a2.src));
        break;
    }
    case iclass_reti: {
        int typ = insn->insn_code & 0xf;
        printf("ret%si %zu", dill_type_names[typ], insn->opnds.a3i.u.imm);
        break;
    }
    case iclass_ret: {
        int typ = insn->insn_code & 0xf;
        printf("ret%s %c%d", dill_type_names[typ], OPND(insn->opnds.a1.src));
        break;
    }
    case iclass_branch: {
        int br_op = insn->insn_code;
        struct branch_table* t = &c->p->branch_table;
        printf("b%s %c%d, %c%d, L%d", branch_op_names[br_op],
               OPND(insn->opnds.br.src1), OPND(insn->opnds.br.src2),
               insn->opnds.br.label);
        if (t->label_name[insn->opnds.br.label] != NULL) {
            printf("<%s>", t->label_name[insn->opnds.br.label]);
        }
        break;
    }
    case iclass_compare: {
        int c_op = insn->insn_code;
        printf("%s %c%d, %c%d, %c%d", compare_op_names[c_op],
               OPND(insn->opnds.a3.dest), OPND(insn->opnds.a3.src1),
               OPND(insn->opnds.a3.src2));
        break;
    }
    case iclass_branchi: {
        int br_op = insn->insn_code;
        struct branch_table* t = &c->p->branch_table;
        printf("b%si %c%d, %p, L%d", branch_op_names[br_op],
               OPND(insn->opnds.bri.src), (void*)insn->opnds.bri.imm_l,
               insn->opnds.bri.label);
        if (t->label_name[insn->opnds.bri.label] != NULL) {
            printf("<%s>", t->label_name[insn->opnds.bri.label]);
        }
        break;
    }
    case iclass_jump_to_label: {
        struct branch_table* t = &c->p->branch_table;
        printf("br L%d", insn->opnds.br.label);
        if (t->label_name[insn->opnds.br.label] != NULL) {
            printf("<%s>", t->label_name[insn->opnds.br.label]);
        }
        break;
    }
    case iclass_mark_label: {
        struct branch_table* t = &c->p->branch_table;
        printf("L%d:", insn->opnds.label.label);
        if (t->label_name[insn->opnds.label.label] != NULL) {
            printf("<%s>", t->label_name[insn->opnds.label.label]);
        }
        break;
    }
    case iclass_jump_to_reg: {
        printf("jmp %c%d", OPND(insn->opnds.br.src1));
        break;
    }
    case iclass_jump_to_imm: {
        printf("jmp 0x%p", insn->opnds.bri.imm_a);
        break;
    }
    case iclass_special: {
        switch (insn->opnds.spec.type) {
        case DILL_NOP:
            printf("special NOP");
            break;
        case DILL_SEGMENTED_FOLLOWS:
            printf("special SEGMENTED %s",
                   prefix_names[insn->opnds.spec.param]);
            break;
        }
        break;
    }
    case iclass_call: {
        int typ = insn->insn_code & 0xf;
        int reg = insn->insn_code & 0x10;
        if (typ != DILL_V) {
            if (reg != 0) {
                printf("call%s R%p, %c%d", dill_type_names[typ],
                       (void*)insn->opnds.calli.imm_l,
                       OPND(insn->opnds.calli.src));
            } else {
                const char* call_name = insn->opnds.calli.xfer_name;
                if (call_name) {
                    printf("call%s 0x%p<%s>, %c%d", dill_type_names[typ],
                           insn->opnds.calli.imm_a, call_name,
                           OPND(insn->opnds.calli.src));
                } else {
                    printf("call%s 0x%p, %c%d", dill_type_names[typ],
                           insn->opnds.calli.imm_a,
                           OPND(insn->opnds.calli.src));
                }
            }
        } else {
            if (reg != 0) {
                printf("call%s R%p", dill_type_names[typ],
                       (void*)insn->opnds.calli.imm_l);
            } else {
                const char* call_name = insn->opnds.calli.xfer_name;
                if (call_name) {
                    printf("call%s 0x%p<%s>", dill_type_names[typ],
                           insn->opnds.calli.imm_a, call_name);
                } else {
                    printf("call%s 0x%p", dill_type_names[typ],
                           insn->opnds.calli.imm_a);
                }
            }
        }
        break;
    }
    case iclass_push: {
        int typ = insn->insn_code & 0xf;
        if ((short)insn->opnds.a1.src < 0) {
            if ((short)insn->opnds.a1.src == -1) {
                printf("pushinit");
            } else {
                int non_var_arg = -((short)insn->opnds.a1.src) - 2;
                printf("pushinit varidiac, %d nonvar args", non_var_arg);
            }
        } else {
            printf("push%s %c%d", dill_type_names[typ],
                   OPND(insn->opnds.a1.src));
        }
        break;
    }
    case iclass_pushi: {
        int typ = insn->insn_code & 0xf;
        if (typ == DILL_P) {
            printf("push%si 0x%p", dill_type_names[typ],
                   insn->opnds.a3i.u.imm_a);
        } else {
            printf("push%si 0x%zx", dill_type_names[typ],
                   insn->opnds.a3i.u.imm);
        }
        break;
    }
    case iclass_pushf: {
        int typ = insn->insn_code;
        printf("push%si %g", dill_type_names[typ], insn->opnds.sf.imm);
        break;
    }
    case iclass_nop:
        printf("nop");
    }
    return sizeof(*insn);
}